

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::AcesInputFile::readPixels(AcesInputFile *this,int scanLine1,int scanLine2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  unsigned_short uVar11;
  Data *pDVar12;
  int iVar13;
  int iVar14;
  Rgba *pRVar15;
  long lVar16;
  float i;
  float fVar17;
  float fVar18;
  
  RgbaInputFile::readPixels(this->_data->rgbaFile,scanLine1,scanLine2);
  pDVar12 = this->_data;
  if (pDVar12->mustConvertColor == true) {
    iVar13 = scanLine1;
    if (scanLine2 < scanLine1) {
      iVar13 = scanLine2;
    }
    lVar16 = (long)iVar13;
    do {
      iVar14 = pDVar12->minX;
      if (iVar14 <= pDVar12->maxX) {
        pRVar15 = pDVar12->fbBase + (long)iVar14 * pDVar12->fbXStride + pDVar12->fbYStride * lVar16;
        iVar14 = iVar14 + -1;
        do {
          fVar1 = half::_toFloat[(pRVar15->r)._h].f;
          fVar2 = half::_toFloat[(pRVar15->g)._h].f;
          fVar3 = half::_toFloat[(pRVar15->b)._h].f;
          fVar18 = (pDVar12->fileToAces).x[1][1];
          fVar4 = (pDVar12->fileToAces).x[0][1];
          fVar5 = (pDVar12->fileToAces).x[2][1];
          fVar6 = (pDVar12->fileToAces).x[3][1];
          fVar7 = (pDVar12->fileToAces).x[1][2];
          fVar8 = (pDVar12->fileToAces).x[0][2];
          fVar9 = (pDVar12->fileToAces).x[2][2];
          fVar10 = (pDVar12->fileToAces).x[3][2];
          fVar17 = (pDVar12->fileToAces).x[3][3] +
                   (pDVar12->fileToAces).x[2][3] * fVar3 +
                   fVar1 * (pDVar12->fileToAces).x[0][3] + (pDVar12->fileToAces).x[1][3] * fVar2;
          i = ((pDVar12->fileToAces).x[3][0] +
              (pDVar12->fileToAces).x[2][0] * fVar3 +
              fVar1 * (pDVar12->fileToAces).x[0][0] + (pDVar12->fileToAces).x[1][0] * fVar2) /
              fVar17;
          if ((i != 0.0) || (NAN(i))) {
            if (half::_eLut[(uint)i >> 0x17] == 0) {
              uVar11 = half::convert((int)i);
            }
            else {
              uVar11 = half::_eLut[(uint)i >> 0x17] +
                       (short)(((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0) >>
                              0xd);
            }
          }
          else {
            uVar11 = (unsigned_short)((uint)i >> 0x10);
          }
          fVar18 = (fVar5 * fVar3 + fVar4 * fVar1 + fVar18 * fVar2 + fVar6) / fVar17;
          (pRVar15->r)._h = uVar11;
          if ((fVar18 != 0.0) || (NAN(fVar18))) {
            if (half::_eLut[(uint)fVar18 >> 0x17] == 0) {
              uVar11 = half::convert((int)fVar18);
            }
            else {
              uVar11 = half::_eLut[(uint)fVar18 >> 0x17] +
                       (short)(((uint)fVar18 & 0x7fffff) + 0xfff +
                               (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar11 = (unsigned_short)((uint)fVar18 >> 0x10);
          }
          fVar17 = (fVar9 * fVar3 + fVar8 * fVar1 + fVar7 * fVar2 + fVar10) / fVar17;
          (pRVar15->g)._h = uVar11;
          if ((fVar17 != 0.0) || (NAN(fVar17))) {
            if (half::_eLut[(uint)fVar17 >> 0x17] == 0) {
              uVar11 = half::convert((int)fVar17);
            }
            else {
              uVar11 = half::_eLut[(uint)fVar17 >> 0x17] +
                       (short)(((uint)fVar17 & 0x7fffff) + 0xfff +
                               (uint)(((uint)fVar17 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar11 = (unsigned_short)((uint)fVar17 >> 0x10);
          }
          (pRVar15->b)._h = uVar11;
          pDVar12 = this->_data;
          pRVar15 = pRVar15 + pDVar12->fbXStride;
          iVar14 = iVar14 + 1;
        } while (iVar14 < pDVar12->maxX);
      }
      lVar16 = lVar16 + 1;
    } while (((scanLine1 + scanLine2) - iVar13) + 1 != (int)lVar16);
  }
  return;
}

Assistant:

void		
AcesInputFile::readPixels (int scanLine1, int scanLine2)
{
    //
    // Copy the pixels from the RgbaInputFile into the frame buffer.
    //

    _data->rgbaFile->readPixels (scanLine1, scanLine2);

    //
    // If the RGB space of the input file is not the same as the ACES
    // RGB space, then the pixels in the frame buffer must be transformed
    // into the ACES RGB space.
    //

    if (!_data->mustConvertColor)
	return;

    int minY = min (scanLine1, scanLine2);
    int maxY = max (scanLine1, scanLine2);

    for (int y = minY; y <= maxY; ++y)
    {
	Rgba *base = _data->fbBase +
		     _data->fbXStride * _data->minX +
		     _data->fbYStride * y;

	for (int x = _data->minX; x <= _data->maxX; ++x)
	{
	    V3f aces = V3f (base->r, base->g, base->b) * _data->fileToAces;

	    base->r = aces[0];
	    base->g = aces[1];
	    base->b = aces[2];

	    base += _data->fbXStride;
	}
    }
}